

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicssceneindex.cpp
# Opt level: O2

QList<QGraphicsItem_*> * __thiscall
QGraphicsSceneIndex::items
          (QList<QGraphicsItem_*> *__return_storage_ptr__,QGraphicsSceneIndex *this,
          QPainterPath *path,ItemSelectionMode mode,SortOrder order,QTransform *deviceTransform)

{
  QGraphicsSceneIndexPrivate *this_00;
  long in_FS_OFFSET;
  QRectF local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QGraphicsSceneIndexPrivate **)(this + 8);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QGraphicsItem **)0x0;
  (__return_storage_ptr__->d).size = 0;
  local_58.w._0_4_ = 0xffffffff;
  local_58.w._4_4_ = 0xffffffff;
  local_58.h._0_4_ = 0xffffffff;
  local_58.h._4_4_ = 0xffffffff;
  local_58.xp._0_4_ = 0xffffffff;
  local_58.xp._4_4_ = 0xffffffff;
  local_58.yp._0_4_ = 0xffffffff;
  local_58.yp._4_4_ = 0xffffffff;
  QPainterPath::controlPointRect();
  _q_adjustRect(&local_58);
  QGraphicsSceneIndexPrivate::items_helper
            (this_00,&local_58,QtPrivate::intersect_path,__return_storage_ptr__,deviceTransform,mode
             ,order,path);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<QGraphicsItem *> QGraphicsSceneIndex::items(const QPainterPath &path, Qt::ItemSelectionMode mode,
                                                  Qt::SortOrder order, const QTransform &deviceTransform) const
{
    Q_D(const QGraphicsSceneIndex);
    QList<QGraphicsItem *> itemList;
    QRectF exposeRect = path.controlPointRect();
    _q_adjustRect(&exposeRect);
    d->items_helper(exposeRect, &QtPrivate::intersect_path, &itemList, deviceTransform, mode, order, &path);
    return itemList;
}